

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::RandomSample<brotli::Histogram<704>,unsigned_short>
               (uint *seed,unsigned_short *data,size_t length,size_t stride,Histogram<704> *sample)

{
  uint uVar1;
  ulong local_38;
  size_t pos;
  Histogram<704> *sample_local;
  size_t stride_local;
  size_t length_local;
  unsigned_short *data_local;
  uint *seed_local;
  
  if (stride < length) {
    uVar1 = MyRand(seed);
    local_38 = (ulong)uVar1 % ((length - stride) + 1);
    sample_local = (Histogram<704> *)stride;
  }
  else {
    local_38 = 0;
    sample_local = (Histogram<704> *)length;
  }
  Histogram<704>::Add<unsigned_short>(sample,data + local_38,(size_t)sample_local);
  return;
}

Assistant:

void RandomSample(unsigned int* seed,
                  const DataType* data,
                  size_t length,
                  size_t stride,
                  HistogramType* sample) {
  size_t pos = 0;
  if (stride >= length) {
    pos = 0;
    stride = length;
  } else {
    pos = MyRand(seed) % (length - stride + 1);
  }
  sample->Add(data + pos, stride);
}